

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O0

uchar core::image::desaturate_luminance<unsigned_char>(uchar *v)

{
  uchar uVar1;
  uchar *v_local;
  
  uVar1 = math::interpolate<unsigned_char>(v,v + 1,v + 2,0.3,0.59,0.11);
  return uVar1;
}

Assistant:

inline T
desaturate_luminance (T const* v)
{
    return math::interpolate(v[0], v[1], v[2], 0.30f, 0.59f, 0.11f);
}